

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_proto_lineNumber(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  ulong uVar2;
  
  if (((((int)this_val.tag == -1) &&
       (uVar2 = (ulong)*(ushort *)((long)this_val.u.ptr + 6), uVar2 < 0x32)) &&
      ((0x2200000012000U >> (uVar2 & 0x3f) & 1) != 0)) &&
     ((lVar1 = *(long *)((long)this_val.u.ptr + 0x30), lVar1 != 0 &&
      ((*(byte *)(lVar1 + 0x1a) & 4) != 0)))) {
    return (JSValue)ZEXT416(*(uint *)(lVar1 + 100));
  }
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_function_proto_lineNumber(JSContext *ctx,
                                            JSValueConst this_val)
{
    JSFunctionBytecode *b = JS_GetFunctionBytecode(this_val);
    if (b && b->has_debug) {
        return JS_NewInt32(ctx, b->debug.line_num);
    }
    return JS_UNDEFINED;
}